

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParserNsPush(xmlParserCtxtPtr ctxt,xmlHashedString *prefix,xmlHashedString *uri,void *saxData
                   ,int defAttr)

{
  uint uVar1;
  xmlChar *pxVar2;
  int iVar3;
  void *__s;
  undefined8 *puVar4;
  uint local_8c;
  xmlChar *local_88;
  uint local_80;
  uint local_7c;
  uint newIndex;
  uint hv;
  uint index;
  uint i;
  uint newSize;
  xmlParserNsBucket *newHash;
  uint oldIndex;
  uint nsIndex;
  uint hashValue;
  xmlChar **ns;
  xmlParserNsExtra *extra;
  xmlParserNsBucket *bucket;
  void *pvStack_30;
  int defAttr_local;
  void *saxData_local;
  xmlHashedString *uri_local;
  xmlHashedString *prefix_local;
  xmlParserCtxtPtr ctxt_local;
  
  extra = (xmlParserNsExtra *)0x0;
  if ((prefix == (xmlHashedString *)0x0) || (prefix->name != ctxt->str_xml)) {
    bucket._4_4_ = defAttr;
    pvStack_30 = saxData;
    saxData_local = uri;
    uri_local = prefix;
    prefix_local = (xmlHashedString *)ctxt;
    if ((ctxt->nsNr < ctxt->nsMax) || (iVar3 = xmlParserNsGrow(ctxt), -1 < iVar3)) {
      if ((uri_local == (xmlHashedString *)0x0) || (uri_local->name == (xmlChar *)0x0)) {
        newHash._4_4_ = *(uint *)(*(long *)(prefix_local + 0x30) + 0x1c);
        if (newHash._4_4_ != 0x7fffffff) {
          if (*(int *)(**(long **)(prefix_local + 0x30) + (ulong)newHash._4_4_ * 0x18 + 0x10) ==
              *(int *)(*(long *)(prefix_local + 0x30) + 0x18)) {
            if (bucket._4_4_ == 0) {
              xmlErrAttributeDup((xmlParserCtxtPtr)prefix_local,(xmlChar *)0x0,"xmlns");
            }
            return 0;
          }
          if (((*(uint *)&prefix_local[0x23].field_0x4 & 0x2000) != 0) &&
             (*(long *)((long)saxData_local + 8) ==
              *(long *)(prefix_local[0x20].name + (ulong)(newHash._4_4_ * 2 + 1) * 8))) {
            return 0;
          }
        }
        *(undefined4 *)(*(long *)(prefix_local + 0x30) + 0x1c) =
             *(undefined4 *)((long)&prefix_local[0x1f].name + 4);
      }
      else {
        newHash._4_4_ =
             xmlParserNsLookup((xmlParserCtxtPtr)prefix_local,uri_local,(xmlParserNsBucket **)&extra
                              );
        if (newHash._4_4_ == 0x7fffffff) {
          uVar1 = uri_local->hashValue;
          if (*(uint *)(*(long *)(prefix_local + 0x30) + 8) >> 1 <
              *(int *)(*(long *)(prefix_local + 0x30) + 0xc) + 1U) {
            if (0x7fffffff < *(uint *)(*(long *)(prefix_local + 0x30) + 8)) {
              xmlErrMemory((xmlParserCtxtPtr)prefix_local);
              return -1;
            }
            if (*(int *)(*(long *)(prefix_local + 0x30) + 8) == 0) {
              local_80 = 0x10;
            }
            else {
              local_80 = *(int *)(*(long *)(prefix_local + 0x30) + 8) << 1;
            }
            __s = (*xmlMalloc)((ulong)local_80 << 3);
            if (__s == (void *)0x0) {
              xmlErrMemory((xmlParserCtxtPtr)prefix_local);
              return -1;
            }
            memset(__s,0,(ulong)local_80 << 3);
            for (hv = 0; hv < *(uint *)(*(long *)(prefix_local + 0x30) + 8); hv = hv + 1) {
              local_7c = *(uint *)(*(long *)(*(long *)(prefix_local + 0x30) + 0x10) + (ulong)hv * 8)
              ;
              if ((local_7c != 0) &&
                 (*(int *)(*(long *)(*(long *)(prefix_local + 0x30) + 0x10) + 4 + (ulong)hv * 8) !=
                  0x7fffffff)) {
                local_7c = local_7c & local_80 - 1;
                while (*(int *)((long)__s + (ulong)local_7c * 8) != 0) {
                  local_7c = local_7c + 1;
                  if (local_7c == local_80) {
                    local_7c = 0;
                  }
                }
                *(undefined8 *)((long)__s + (ulong)local_7c * 8) =
                     *(undefined8 *)
                      (*(long *)(*(long *)(prefix_local + 0x30) + 0x10) + (ulong)hv * 8);
              }
            }
            (*xmlFree)(*(void **)(*(long *)(prefix_local + 0x30) + 0x10));
            *(void **)(*(long *)(prefix_local + 0x30) + 0x10) = __s;
            *(uint *)(*(long *)(prefix_local + 0x30) + 8) = local_80;
            newIndex = uVar1 & local_80 - 1;
            while (*(int *)((long)__s + (ulong)newIndex * 8) != 0) {
              newIndex = newIndex + 1;
              if (newIndex == local_80) {
                newIndex = 0;
              }
            }
            extra = (xmlParserNsExtra *)((long)__s + (ulong)newIndex * 8);
          }
          *(uint *)&extra->saxData = uVar1;
          *(undefined4 *)((long)&extra->saxData + 4) =
               *(undefined4 *)((long)&prefix_local[0x1f].name + 4);
          *(int *)(*(long *)(prefix_local + 0x30) + 0xc) =
               *(int *)(*(long *)(prefix_local + 0x30) + 0xc) + 1;
          newHash._4_4_ = 0x7fffffff;
        }
        else {
          if (*(int *)(**(long **)(prefix_local + 0x30) + (ulong)newHash._4_4_ * 0x18 + 0x10) ==
              *(int *)(*(long *)(prefix_local + 0x30) + 0x18)) {
            if (bucket._4_4_ == 0) {
              xmlErrAttributeDup((xmlParserCtxtPtr)prefix_local,"xmlns",uri_local->name);
            }
            return 0;
          }
          if (((*(uint *)&prefix_local[0x23].field_0x4 & 0x2000) != 0) &&
             (*(long *)((long)saxData_local + 8) ==
              *(long *)(prefix_local[0x20].name +
                       (long)(*(int *)((long)&extra->saxData + 4) * 2 + 1) * 8))) {
            return 0;
          }
          *(undefined4 *)((long)&extra->saxData + 4) =
               *(undefined4 *)((long)&prefix_local[0x1f].name + 4);
        }
      }
      uVar1 = *(uint *)((long)&prefix_local[0x1f].name + 4);
      pxVar2 = prefix_local[0x20].name;
      if (uri_local == (xmlHashedString *)0x0) {
        local_88 = (xmlChar *)0x0;
      }
      else {
        local_88 = uri_local->name;
      }
      *(xmlChar **)(pxVar2 + (ulong)(uVar1 << 1) * 8) = local_88;
      *(undefined8 *)(pxVar2 + (ulong)(uVar1 << 1) * 8 + 8) =
           *(undefined8 *)((long)saxData_local + 8);
      puVar4 = (undefined8 *)(**(long **)(prefix_local + 0x30) + (ulong)uVar1 * 0x18);
      *puVar4 = pvStack_30;
      if (uri_local == (xmlHashedString *)0x0) {
        local_8c = 0;
      }
      else {
        local_8c = uri_local->hashValue;
      }
      *(uint *)(puVar4 + 1) = local_8c;
      *(undefined4 *)((long)puVar4 + 0xc) = *saxData_local;
      *(undefined4 *)(puVar4 + 2) = *(undefined4 *)(*(long *)(prefix_local + 0x30) + 0x18);
      *(uint *)((long)puVar4 + 0x14) = newHash._4_4_;
      *(int *)((long)&prefix_local[0x1f].name + 4) =
           *(int *)((long)&prefix_local[0x1f].name + 4) + 1;
      ctxt_local._4_4_ = 1;
    }
    else {
      xmlErrMemory((xmlParserCtxtPtr)prefix_local);
      ctxt_local._4_4_ = -1;
    }
  }
  else {
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlParserNsPush(xmlParserCtxtPtr ctxt, const xmlHashedString *prefix,
                const xmlHashedString *uri, void *saxData, int defAttr) {
    xmlParserNsBucket *bucket = NULL;
    xmlParserNsExtra *extra;
    const xmlChar **ns;
    unsigned hashValue, nsIndex, oldIndex;

    if ((prefix != NULL) && (prefix->name == ctxt->str_xml))
        return(0);

    if ((ctxt->nsNr >= ctxt->nsMax) && (xmlParserNsGrow(ctxt) < 0)) {
        xmlErrMemory(ctxt);
        return(-1);
    }

    /*
     * Default namespace and 'xml' namespace
     */
    if ((prefix == NULL) || (prefix->name == NULL)) {
        oldIndex = ctxt->nsdb->defaultNsIndex;

        if (oldIndex != INT_MAX) {
            extra = &ctxt->nsdb->extra[oldIndex];

            if (extra->elementId == ctxt->nsdb->elementId) {
                if (defAttr == 0)
                    xmlErrAttributeDup(ctxt, NULL, BAD_CAST "xmlns");
                return(0);
            }

            if ((ctxt->options & XML_PARSE_NSCLEAN) &&
                (uri->name == ctxt->nsTab[oldIndex * 2 + 1]))
                return(0);
        }

        ctxt->nsdb->defaultNsIndex = ctxt->nsNr;
        goto populate_entry;
    }

    /*
     * Hash table lookup
     */
    oldIndex = xmlParserNsLookup(ctxt, prefix, &bucket);
    if (oldIndex != INT_MAX) {
        extra = &ctxt->nsdb->extra[oldIndex];

        /*
         * Check for duplicate definitions on the same element.
         */
        if (extra->elementId == ctxt->nsdb->elementId) {
            if (defAttr == 0)
                xmlErrAttributeDup(ctxt, BAD_CAST "xmlns", prefix->name);
            return(0);
        }

        if ((ctxt->options & XML_PARSE_NSCLEAN) &&
            (uri->name == ctxt->nsTab[bucket->index * 2 + 1]))
            return(0);

        bucket->index = ctxt->nsNr;
        goto populate_entry;
    }

    /*
     * Insert new bucket
     */

    hashValue = prefix->hashValue;

    /*
     * Grow hash table, 50% fill factor
     */
    if (ctxt->nsdb->hashElems + 1 > ctxt->nsdb->hashSize / 2) {
        xmlParserNsBucket *newHash;
        unsigned newSize, i, index;

        if (ctxt->nsdb->hashSize > UINT_MAX / 2) {
            xmlErrMemory(ctxt);
            return(-1);
        }
        newSize = ctxt->nsdb->hashSize ? ctxt->nsdb->hashSize * 2 : 16;
        newHash = xmlMalloc(newSize * sizeof(newHash[0]));
        if (newHash == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
        memset(newHash, 0, newSize * sizeof(newHash[0]));

        for (i = 0; i < ctxt->nsdb->hashSize; i++) {
            unsigned hv = ctxt->nsdb->hash[i].hashValue;
            unsigned newIndex;

            if ((hv == 0) || (ctxt->nsdb->hash[i].index == INT_MAX))
                continue;
            newIndex = hv & (newSize - 1);

            while (newHash[newIndex].hashValue != 0) {
                newIndex++;
                if (newIndex == newSize)
                    newIndex = 0;
            }

            newHash[newIndex] = ctxt->nsdb->hash[i];
        }

        xmlFree(ctxt->nsdb->hash);
        ctxt->nsdb->hash = newHash;
        ctxt->nsdb->hashSize = newSize;

        /*
         * Relookup
         */
        index = hashValue & (newSize - 1);

        while (newHash[index].hashValue != 0) {
            index++;
            if (index == newSize)
                index = 0;
        }

        bucket = &newHash[index];
    }

    bucket->hashValue = hashValue;
    bucket->index = ctxt->nsNr;
    ctxt->nsdb->hashElems++;
    oldIndex = INT_MAX;

populate_entry:
    nsIndex = ctxt->nsNr;

    ns = &ctxt->nsTab[nsIndex * 2];
    ns[0] = prefix ? prefix->name : NULL;
    ns[1] = uri->name;

    extra = &ctxt->nsdb->extra[nsIndex];
    extra->saxData = saxData;
    extra->prefixHashValue = prefix ? prefix->hashValue : 0;
    extra->uriHashValue = uri->hashValue;
    extra->elementId = ctxt->nsdb->elementId;
    extra->oldIndex = oldIndex;

    ctxt->nsNr++;

    return(1);
}